

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O0

int vt_tag_cb(void *sysdata,void *userdata)

{
  ushort uVar1;
  short *psVar2;
  long lVar3;
  ulong uVar4;
  uint32_t *data;
  int num;
  int i;
  prf_node_t *node;
  uint8_t *rlt;
  prf_state_t *state;
  void *userdata_local;
  void *sysdata_local;
  int local_4;
  
  psVar2 = *(short **)((long)sysdata + 8);
  if ((*(uint *)(psVar2 + 2) & 1) == 0) {
    if ((*psVar2 == 0x48) || (*psVar2 == 0x59)) {
      lVar3 = *(long *)(psVar2 + 4);
      uVar1 = psVar2[1];
      for (i = 0; i < (int)(uVar1 - 4) / 4; i = i + 1) {
        uVar4 = (ulong)*(uint *)(lVar3 + (long)i * 4);
        *(int *)((long)userdata + uVar4) = *(int *)((long)userdata + uVar4) + 1;
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 2;
  }
  return local_4;
}

Assistant:

static
int
vt_tag_cb(
    void * sysdata,
    void * userdata )
{
    prf_state_t * state = (prf_state_t *) sysdata;
    uint8_t * rlt = (uint8_t *) userdata;
    prf_node_t * node = state->node;

    if ( node->flags & PRF_NODE_DELETED )
        return PRF_TRAV_SIBLING;

    switch ( node->opcode ) {
    case 72: /* vertex list */
    case 89: /* morph vertex list */
        do {
            int i, num;
            uint32_t * data;
            data = (uint32_t *) node->data;
            num = (node->length - 4) / 4;
            for ( i = 0; i < num; i++ )
                ((uint32_t *)(rlt + data[i]))[0] += 1;
        } while ( FALSE );
        break;
    default:
        break;
    }
    return PRF_TRAV_CONTINUE;
}